

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

void __thiscall
wallet::LegacyScriptPubKeyMan::DeriveNewChildKey
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CKeyMetadata *metadata,CKey *secret,
          CHDChain *hd_chain,bool internal)

{
  CKeyID *pCVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint32_t *t;
  undefined4 uVar2;
  undefined4 uVar3;
  WalletStorage *pWVar4;
  iterator iVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  runtime_error *prVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  uint index;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Span<const_std::byte> seed_00;
  CKey seed;
  CKeyID master_id;
  CExtKey childKey;
  CExtKey chainChildKey;
  CExtKey accountKey;
  CExtKey masterKey;
  undefined1 local_1d0 [8];
  array<unsigned_char,_32UL> *local_1c8;
  undefined1 local_1c0 [72];
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [28];
  undefined1 local_11c [16];
  undefined1 local_108 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_100;
  undefined1 local_f8 [28];
  undefined1 local_dc [16];
  bool local_c8;
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_c0;
  undefined1 local_b8 [28];
  undefined1 local_9c [16];
  bool local_88;
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_80;
  undefined1 local_78 [28];
  undefined1 local_5c [16];
  undefined1 local_48 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1d0[0] = 0;
  local_1c8 = (array<unsigned_char,_32UL> *)0x0;
  local_5c = (undefined1  [16])0x0;
  local_78._12_16_ = (undefined1  [16])0x0;
  local_48[0] = false;
  local_40._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        )(_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  local_9c = (undefined1  [16])0x0;
  local_b8._12_16_ = (undefined1  [16])0x0;
  local_88 = false;
  local_80._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  local_dc = (undefined1  [16])0x0;
  local_f8._12_16_ = (undefined1  [16])0x0;
  local_c8 = false;
  local_c0._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        )(_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  local_11c = (undefined1  [16])0x0;
  local_138._12_16_ = (undefined1  [16])0x0;
  local_108[0] = false;
  local_100._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  pCVar1 = &hd_chain->seed_id;
  iVar8 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1e])
                    (this,pCVar1,local_1d0);
  if ((char)iVar8 == '\0') {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"DeriveNewChildKey","");
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_158,": seed not found");
    local_1c0._0_8_ = (pbVar9->_M_dataplus)._M_p;
    paVar11 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ == paVar11) {
      local_1c0._16_8_ = paVar11->_M_allocated_capacity;
      local_1c0._24_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      local_1c0._0_8_ = local_1c0 + 0x10;
    }
    else {
      local_1c0._16_8_ = paVar11->_M_allocated_capacity;
    }
    local_1c0._8_8_ = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(prVar10,(string *)local_1c0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    seed_00.m_size._0_4_ = (uint)(local_1c8 != (array<unsigned_char,_32UL> *)0x0) << 5;
    seed_00.m_data = local_1c8->_M_elems;
    seed_00.m_size._4_4_ = 0;
    CExtKey::SetSeed((CExtKey *)local_78,seed_00);
    index = 0x80000000;
    DeriveExtKey((CExtKey *)local_78,0x80000000,(CExtKey *)local_b8);
    if (internal) {
      pWVar4 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      iVar8 = (*pWVar4->_vptr_WalletStorage[6])(pWVar4,0x2227c);
      index = 0x80000001;
      if ((char)iVar8 == '\0') {
        __assert_fail("internal ? m_storage.CanSupportFeature(FEATURE_HD_SPLIT) : true",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                      ,0x47b,
                      "void wallet::LegacyScriptPubKeyMan::DeriveNewChildKey(WalletBatch &, CKeyMetadata &, CKey &, CHDChain &, bool)"
                     );
      }
    }
    DeriveExtKey((CExtKey *)local_b8,index,(CExtKey *)local_f8);
    this_00 = &(metadata->key_origin).path;
    t = &hd_chain->nInternalChainCounter;
    do {
      if (internal) {
        DeriveExtKey((CExtKey *)local_f8,*t | 0x80000000,(CExtKey *)local_138);
        util::ToString<unsigned_int>(&local_178,t);
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_178,0,0,"m/0\'/1\'/",8);
        local_158._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
        paVar11 = &pbVar9->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p == paVar11) {
          local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        }
        local_158._M_string_length = pbVar9->_M_string_length;
        (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar9->_M_string_length = 0;
        (pbVar9->field_2)._M_local_buf[0] = '\0';
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_158,"\'");
        local_1c0._0_8_ = (pbVar9->_M_dataplus)._M_p;
        paVar11 = &pbVar9->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._0_8_ == paVar11) {
          local_1c0._16_8_ = paVar11->_M_allocated_capacity;
          local_1c0._24_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          local_1c0._0_8_ = local_1c0 + 0x10;
        }
        else {
          local_1c0._16_8_ = paVar11->_M_allocated_capacity;
        }
        local_1c0._8_8_ = pbVar9->_M_string_length;
        (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar9->_M_string_length = 0;
        (pbVar9->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&metadata->hdKeypath,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
        if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
          operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_178._M_dataplus._M_p._4_4_,local_178._M_dataplus._M_p._0_4_) !=
            &local_178.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_178._M_dataplus._M_p._4_4_,local_178._M_dataplus._M_p._0_4_
                                  ),local_178.field_2._M_allocated_capacity + 1);
        }
        local_1c0[0] = '\0';
        local_1c0[1] = '\0';
        local_1c0[2] = '\0';
        local_1c0[3] = 0x80;
        iVar5._M_current =
             (metadata->key_origin).path.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (metadata->key_origin).path.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (this_00,iVar5,(uint *)local_1c0);
        }
        else {
          *iVar5._M_current = 0x80000000;
          (metadata->key_origin).path.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_1c0[0] = '\x01';
        local_1c0[1] = '\0';
        local_1c0[2] = '\0';
        local_1c0[3] = 0x80;
        iVar5._M_current =
             (metadata->key_origin).path.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (metadata->key_origin).path.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (this_00,iVar5,(uint *)local_1c0);
        }
        else {
          *iVar5._M_current = 0x80000001;
          (metadata->key_origin).path.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_1c0._0_8_ = CONCAT44(local_1c0._4_4_,*t) | 0x80000000;
        iVar5._M_current =
             (metadata->key_origin).path.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (metadata->key_origin).path.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (this_00,iVar5,(uint *)local_1c0);
        }
        else {
          *iVar5._M_current = *t | 0x80000000;
          (metadata->key_origin).path.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        *t = *t + 1;
      }
      else {
        DeriveExtKey((CExtKey *)local_f8,hd_chain->nExternalChainCounter | 0x80000000,
                     (CExtKey *)local_138);
        util::ToString<unsigned_int>(&local_178,&hd_chain->nExternalChainCounter);
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_178,0,0,"m/0\'/0\'/",8);
        local_158._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
        paVar11 = &pbVar9->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p == paVar11) {
          local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        }
        local_158._M_string_length = pbVar9->_M_string_length;
        (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar9->_M_string_length = 0;
        (pbVar9->field_2)._M_local_buf[0] = '\0';
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_158,"\'");
        local_1c0._0_8_ = (pbVar9->_M_dataplus)._M_p;
        paVar11 = &pbVar9->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._0_8_ == paVar11) {
          local_1c0._16_8_ = paVar11->_M_allocated_capacity;
          local_1c0._24_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          local_1c0._0_8_ = local_1c0 + 0x10;
        }
        else {
          local_1c0._16_8_ = paVar11->_M_allocated_capacity;
        }
        local_1c0._8_8_ = pbVar9->_M_string_length;
        (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar9->_M_string_length = 0;
        (pbVar9->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&metadata->hdKeypath,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
        if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
          operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_178._M_dataplus._M_p._4_4_,local_178._M_dataplus._M_p._0_4_) !=
            &local_178.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_178._M_dataplus._M_p._4_4_,local_178._M_dataplus._M_p._0_4_
                                  ),local_178.field_2._M_allocated_capacity + 1);
        }
        local_1c0[0] = '\0';
        local_1c0[1] = '\0';
        local_1c0[2] = '\0';
        local_1c0[3] = 0x80;
        iVar5._M_current =
             (metadata->key_origin).path.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (metadata->key_origin).path.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (this_00,iVar5,(uint *)local_1c0);
        }
        else {
          *iVar5._M_current = 0x80000000;
          (metadata->key_origin).path.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_1c0[0] = '\0';
        local_1c0[1] = '\0';
        local_1c0[2] = '\0';
        local_1c0[3] = 0x80;
        iVar5._M_current =
             (metadata->key_origin).path.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (metadata->key_origin).path.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (this_00,iVar5,(uint *)local_1c0);
        }
        else {
          *iVar5._M_current = 0x80000000;
          (metadata->key_origin).path.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_1c0._0_8_ = CONCAT44(local_1c0._4_4_,hd_chain->nExternalChainCounter) | 0x80000000;
        iVar5._M_current =
             (metadata->key_origin).path.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (metadata->key_origin).path.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (this_00,iVar5,(uint *)local_1c0);
        }
        else {
          *iVar5._M_current = hd_chain->nExternalChainCounter | 0x80000000;
          (metadata->key_origin).path.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        hd_chain->nExternalChainCounter = hd_chain->nExternalChainCounter + 1;
      }
      CKey::GetPubKey((CPubKey *)local_1c0,(CKey *)local_108);
      CPubKey::GetID((CKeyID *)&local_158,(CPubKey *)local_1c0);
      iVar8 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1d])
                        (this,&local_158);
    } while ((char)iVar8 != '\0');
    CKey::operator=(secret,(CKey *)local_108);
    *(undefined4 *)
     ((metadata->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10) =
         *(undefined4 *)
          ((hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10);
    uVar6 = *(undefined8 *)
             ((hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8);
    *(undefined8 *)(metadata->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems =
         *(undefined8 *)(pCVar1->super_uint160).super_base_blob<160U>.m_data._M_elems;
    *(undefined8 *)((metadata->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8)
         = uVar6;
    CKey::GetPubKey((CPubKey *)local_1c0,(CKey *)local_48);
    CPubKey::GetID((CKeyID *)&local_178,(CPubKey *)local_1c0);
    *(undefined4 *)(metadata->key_origin).fingerprint = local_178._M_dataplus._M_p._0_4_;
    metadata->has_key_origin = true;
    auVar12[0] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                   super_base_blob<160U>.m_data._M_elems[0] ==
                  (pCVar1->super_uint160).super_base_blob<160U>.m_data._M_elems[0]);
    auVar12[1] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                   super_base_blob<160U>.m_data._M_elems[1] ==
                  (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[1]);
    auVar12[2] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                   super_base_blob<160U>.m_data._M_elems[2] ==
                  (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[2]);
    auVar12[3] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                   super_base_blob<160U>.m_data._M_elems[3] ==
                  (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[3]);
    auVar12[4] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                   super_base_blob<160U>.m_data._M_elems[4] ==
                  (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[4]);
    auVar12[5] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                   super_base_blob<160U>.m_data._M_elems[5] ==
                  (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[5]);
    auVar12[6] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                   super_base_blob<160U>.m_data._M_elems[6] ==
                  (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[6]);
    auVar12[7] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                   super_base_blob<160U>.m_data._M_elems[7] ==
                  (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[7]);
    auVar12[8] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                   super_base_blob<160U>.m_data._M_elems[8] ==
                  (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[8]);
    auVar12[9] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                   super_base_blob<160U>.m_data._M_elems[9] ==
                  (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[9]);
    auVar12[10] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                    super_base_blob<160U>.m_data._M_elems[10] ==
                   (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[10]);
    auVar12[0xb] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[0xb] ==
                    (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xb]);
    auVar12[0xc] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[0xc] ==
                    (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xc]);
    auVar12[0xd] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[0xd] ==
                    (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xd]);
    auVar12[0xe] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[0xe] ==
                    (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xe]);
    auVar12[0xf] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[0xf] ==
                    (hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xf]);
    uVar2 = *(undefined4 *)
             ((hd_chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10);
    uVar3 = *(undefined4 *)
             ((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
              m_data._M_elems + 0x10);
    auVar13[0] = -((char)uVar3 == (char)uVar2);
    auVar13[1] = -((char)((uint)uVar3 >> 8) == (char)((uint)uVar2 >> 8));
    auVar13[2] = -((char)((uint)uVar3 >> 0x10) == (char)((uint)uVar2 >> 0x10));
    auVar13[3] = -((char)((uint)uVar3 >> 0x18) == (char)((uint)uVar2 >> 0x18));
    auVar13[4] = 0xff;
    auVar13[5] = 0xff;
    auVar13[6] = 0xff;
    auVar13[7] = 0xff;
    auVar13[8] = 0xff;
    auVar13[9] = 0xff;
    auVar13[10] = 0xff;
    auVar13[0xb] = 0xff;
    auVar13[0xc] = 0xff;
    auVar13[0xd] = 0xff;
    auVar13[0xe] = 0xff;
    auVar13[0xf] = 0xff;
    auVar13 = auVar13 & auVar12;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff) {
      bVar7 = WalletBatch::WriteHDChain(batch,hd_chain);
      if (!bVar7) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"DeriveNewChildKey","")
        ;
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_158,": writing HD chain model failed");
        local_1c0._0_8_ = (pbVar9->_M_dataplus)._M_p;
        paVar11 = &pbVar9->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._0_8_ == paVar11) {
          local_1c0._16_8_ = paVar11->_M_allocated_capacity;
          local_1c0._24_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          local_1c0._0_8_ = local_1c0 + 0x10;
        }
        else {
          local_1c0._16_8_ = paVar11->_M_allocated_capacity;
        }
        local_1c0._8_8_ = pbVar9->_M_string_length;
        (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar9->_M_string_length = 0;
        (pbVar9->field_2)._M_local_buf[0] = '\0';
        std::runtime_error::runtime_error(prVar10,(string *)local_1c0);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_004da8aa;
      }
    }
    if (local_100._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_100,
                 local_100._M_head_impl);
    }
    if (local_c0._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_c0,
                 (array<unsigned_char,_32UL> *)
                 local_c0._M_t.
                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
    }
    if (local_80._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_80,
                 local_80._M_head_impl);
    }
    if (local_40._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_40,
                 (array<unsigned_char,_32UL> *)
                 local_40._M_t.
                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
    }
    if (local_1c8 != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1c8,local_1c8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
LAB_004da8aa:
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::DeriveNewChildKey(WalletBatch &batch, CKeyMetadata& metadata, CKey& secret, CHDChain& hd_chain, bool internal)
{
    // for now we use a fixed keypath scheme of m/0'/0'/k
    CKey seed;                     //seed (256bit)
    CExtKey masterKey;             //hd master key
    CExtKey accountKey;            //key at m/0'
    CExtKey chainChildKey;         //key at m/0'/0' (external) or m/0'/1' (internal)
    CExtKey childKey;              //key at m/0'/0'/<n>'

    // try to get the seed
    if (!GetKey(hd_chain.seed_id, seed))
        throw std::runtime_error(std::string(__func__) + ": seed not found");

    masterKey.SetSeed(seed);

    // derive m/0'
    // use hardened derivation (child keys >= 0x80000000 are hardened after bip32)
    DeriveExtKey(masterKey, BIP32_HARDENED_KEY_LIMIT, accountKey);

    // derive m/0'/0' (external chain) OR m/0'/1' (internal chain)
    assert(internal ? m_storage.CanSupportFeature(FEATURE_HD_SPLIT) : true);
    DeriveExtKey(accountKey, BIP32_HARDENED_KEY_LIMIT+(internal ? 1 : 0), chainChildKey);

    // derive child key at next index, skip keys already known to the wallet
    do {
        // always derive hardened keys
        // childIndex | BIP32_HARDENED_KEY_LIMIT = derive childIndex in hardened child-index-range
        // example: 1 | BIP32_HARDENED_KEY_LIMIT == 0x80000001 == 2147483649
        if (internal) {
            DeriveExtKey(chainChildKey, hd_chain.nInternalChainCounter | BIP32_HARDENED_KEY_LIMIT, childKey);
            metadata.hdKeypath = "m/0'/1'/" + ToString(hd_chain.nInternalChainCounter) + "'";
            metadata.key_origin.path.push_back(0 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(1 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(hd_chain.nInternalChainCounter | BIP32_HARDENED_KEY_LIMIT);
            hd_chain.nInternalChainCounter++;
        }
        else {
            DeriveExtKey(chainChildKey, hd_chain.nExternalChainCounter | BIP32_HARDENED_KEY_LIMIT, childKey);
            metadata.hdKeypath = "m/0'/0'/" + ToString(hd_chain.nExternalChainCounter) + "'";
            metadata.key_origin.path.push_back(0 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(0 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(hd_chain.nExternalChainCounter | BIP32_HARDENED_KEY_LIMIT);
            hd_chain.nExternalChainCounter++;
        }
    } while (HaveKey(childKey.key.GetPubKey().GetID()));
    secret = childKey.key;
    metadata.hd_seed_id = hd_chain.seed_id;
    CKeyID master_id = masterKey.key.GetPubKey().GetID();
    std::copy(master_id.begin(), master_id.begin() + 4, metadata.key_origin.fingerprint);
    metadata.has_key_origin = true;
    // update the chain model in the database
    if (hd_chain.seed_id == m_hd_chain.seed_id && !batch.WriteHDChain(hd_chain))
        throw std::runtime_error(std::string(__func__) + ": writing HD chain model failed");
}